

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O2

bool ppmb_read_data(ifstream *input,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char c;
  int local_40;
  int local_3c;
  ulong local_38;
  
  uVar4 = 0;
  if (xsize < 1) {
    xsize = 0;
  }
  iVar2 = 0;
  local_40 = ysize;
  local_3c = xsize;
  if (0 < ysize) {
    iVar2 = ysize;
  }
  do {
    if ((int)uVar4 == iVar2) {
LAB_0010513d:
      return (int)uVar4 < local_40;
    }
    local_38 = uVar4;
    for (iVar3 = 0; local_3c != iVar3; iVar3 = iVar3 + 1) {
      std::istream::read((char *)input,(long)&c);
      if (r == (uchar *)0x0) {
        r = (uchar *)0x0;
      }
      else {
        *r = c;
        r = r + 1;
      }
      if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
        pcVar5 = "  End of file reading R byte of pixel (";
LAB_001050d4:
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"PPMB_READ_DATA - Fatal error!\n");
        poVar1 = std::operator<<((ostream *)&std::cout,pcVar5);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
        poVar1 = std::operator<<(poVar1,", ");
        uVar4 = local_38;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_38);
        std::operator<<(poVar1,") \n");
        goto LAB_0010513d;
      }
      std::istream::read((char *)input,(long)&c);
      if (g == (uchar *)0x0) {
        g = (uchar *)0x0;
      }
      else {
        *g = c;
        g = g + 1;
      }
      if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
        pcVar5 = "  End of file reading G byte of pixel (";
        goto LAB_001050d4;
      }
      std::istream::read((char *)input,(long)&c);
      if (b == (uchar *)0x0) {
        b = (uchar *)0x0;
      }
      else {
        *b = c;
        b = b + 1;
      }
      if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
        pcVar5 = "  End of file reading B byte of pixel (";
        goto LAB_001050d4;
      }
    }
    uVar4 = (ulong)((int)local_38 + 1);
  } while( true );
}

Assistant:

bool ppmb_read_data ( ifstream &input, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_READ_DATA reads the data in a binary portable pixel map file.
//
//  Discussion:
//
//    If the ordinary ">>" operator is used to input the data, then data that
//    happens to look like new lines or other white space is skipped.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 December 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, ifstream &input, a pointer to the file containing the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_READ_DATA, is true if an error occurred.
//
{
  char c;
  bool error;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int k;

  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      input.read ( &c, 1 );
	  if (indexr) {
        *indexr = ( unsigned char ) c;
         indexr = indexr + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading R byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexg) {
        *indexg = ( unsigned char ) c;
         indexg = indexg + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading G byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexb) {
        *indexb = ( unsigned char ) c;
        indexb = indexb + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading B byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

    }
  }
  return false;
}